

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredMMDPDiscrete.h
# Opt level: O1

void __thiscall
FactoredMMDPDiscrete::FactoredMMDPDiscrete
          (FactoredMMDPDiscrete *this,void **vtt,string *name,string *descr,string *pf)

{
  pointer pcVar1;
  void *pvVar2;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (descr->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + descr->_M_string_length);
  pcVar1 = (pf->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + pf->_M_string_length);
  FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete
            (&this->super_FactoredDecPOMDPDiscrete,vtt + 1,&local_50,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pvVar2 = *vtt;
  *(void **)&(this->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess =
       pvVar2;
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 + *(long *)((long)pvVar2 + -0x58)) = vtt[0x14];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x60)) = vtt[0x15];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x68)) = vtt[0x16];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x70)) = vtt[0x17];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0x18];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x50)) = vtt[0x19];
  *(void **)(&(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
              field_0x0 +
            *(long *)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[0x1a];
  *(void **)&(this->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates.field_0x600 = vtt[0x1b];
  return;
}

Assistant:

FactoredMMDPDiscrete(
    std::string name="received unspec. by FactoredMMDPDiscrete", 
    std::string descr="received unspec. by FactoredMMDPDiscrete", 
    std::string pf="received unspec. by FactoredMMDPDiscrete")
        : FactoredDecPOMDPDiscrete(name, descr, pf)
    {
        //SetFlatObservationModel(new ObservationModelIdentityMapping());
        
        //MADPComponentDiscreteObservations::SetInitialized(true) can
        //overflow _m_nrJointObservations (indicated by _m_jointIndicesValid).
        //(likely)

        //Problem occurs if single observation variable's stepsize
        //calculations already overflow (happens in 2DBN::InitializeIIs()).
        //(unlikely)
    }